

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O2

ValidSchema __thiscall avro::compileJsonSchemaFromStream(avro *this,InputStream *is)

{
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar1;
  ValidSchema VVar2;
  NodePtr n;
  Entity e;
  SymbolTable st;
  allocator<char> local_79;
  NodePtr local_78;
  Entity local_68;
  string local_58;
  _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
  local_38;
  
  json::loadEntity((json *)&local_68,is);
  local_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_38._M_impl.super__Rb_tree_header._M_header;
  local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_79);
  makeNode((avro *)&local_78,&local_68,(SymbolTable *)&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  ValidSchema::ValidSchema((ValidSchema *)this,&local_78);
  boost::detail::shared_count::~shared_count(&local_78.pn);
  std::
  _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
  ::~_Rb_tree(&local_38);
  sVar1.pi_ = extraout_RDX;
  if (local_68.value_.content != (placeholder *)0x0) {
    (*(local_68.value_.content)->_vptr_placeholder[1])();
    sVar1.pi_ = extraout_RDX_00;
  }
  VVar2.root_.pn.pi_ = sVar1.pi_;
  VVar2.root_.px = (element_type *)this;
  return (ValidSchema)VVar2.root_;
}

Assistant:

AVRO_DECL ValidSchema compileJsonSchemaFromStream(InputStream& is)
{
    json::Entity e = json::loadEntity(is);
    SymbolTable st;
    NodePtr n = makeNode(e, st, "");
    return ValidSchema(n);
}